

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O2

void __thiscall
ear::PolarExtent::PolarExtent(PolarExtent *this,shared_ptr<ear::PointSourcePanner> *psp_)

{
  __uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_> local_20;
  
  get_polar_extent_core();
  PolarExtent(this,psp_,
              (unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_> *)
              &local_20);
  if (local_20._M_t.
      super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>.
      super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                          .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl + 8))()
    ;
  }
  return;
}

Assistant:

PolarExtent::PolarExtent(const std::shared_ptr<PointSourcePanner> &psp_)
      : PolarExtent(psp_, get_polar_extent_core()) {}